

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall
binlog::PrettyPrinter::printTimeField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,BrokenDownTime *bdt,int tzoffset,
          char *tzname)

{
  size_t __n;
  int iVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  int i;
  char acStack_38 [16];
  
  iVar1 = (int)CONCAT71(in_register_00000011,spec);
  if (iVar1 == 0x48) {
    iVar1 = (bdt->super_tm).tm_hour;
  }
  else if (iVar1 == 0x4d) {
    iVar1 = (bdt->super_tm).tm_min;
  }
  else {
    if (iVar1 == 0x4e) {
      __n = (size_t)(uint)bdt->tm_nsec;
      snprintf(acStack_38,0x10,"%.9d");
      detail::OstreamBuffer::write(out,(int)acStack_38,(void *)0x9,__n);
      return;
    }
    if (iVar1 == 0x53) {
      iVar1 = (bdt->super_tm).tm_sec;
    }
    else if (iVar1 == 0x7a) {
      uVar2 = (ulong)(uint)-tzoffset;
      if (0 < tzoffset) {
        uVar2 = (ulong)(uint)tzoffset;
      }
      i = (int)(uVar2 / 0xe10);
      iVar1 = i * -0x3c + (int)(uVar2 / 0x3c);
      detail::OstreamBuffer::put(out,(char)(tzoffset >> 0x1f) * -2 + '+');
      if (359999 < (uint)uVar2) {
        i = 0;
      }
      anon_unknown.dwarf_2e0609::printTwoDigits(out,i);
      if (99 < iVar1) {
        iVar1 = 0;
      }
    }
    else {
      if (iVar1 == 0x5a) {
        detail::OstreamBuffer::operator<<(out,tzname);
        return;
      }
      if (iVar1 == 100) {
        iVar1 = (bdt->super_tm).tm_mday;
      }
      else if (iVar1 == 0x6d) {
        iVar1 = (bdt->super_tm).tm_mon + 1;
      }
      else {
        if (iVar1 != 0x79) {
          if (iVar1 != 0x59) {
            detail::OstreamBuffer::put(out,'%');
            detail::OstreamBuffer::put(out,spec);
            return;
          }
          detail::OstreamBuffer::operator<<(out,(bdt->super_tm).tm_year + 0x76c);
          return;
        }
        iVar1 = (bdt->super_tm).tm_year % 100;
      }
    }
  }
  anon_unknown.dwarf_2e0609::printTwoDigits(out,iVar1);
  return;
}

Assistant:

void PrettyPrinter::printTimeField(detail::OstreamBuffer& out, char spec, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  switch (spec)
  {
  case 'Y':
    out << bdt.tm_year + 1900;
    break;
  case 'y':
    printTwoDigits(out, bdt.tm_year % 100);
    break;
  case 'm':
    printTwoDigits(out, bdt.tm_mon + 1);
    break;
  case 'd':
    printTwoDigits(out, bdt.tm_mday);
    break;
  case 'H':
    printTwoDigits(out, bdt.tm_hour);
    break;
  case 'M':
    printTwoDigits(out, bdt.tm_min);
    break;
  case 'S':
    printTwoDigits(out, bdt.tm_sec);
    break;
  case 'z':
    printTimeZoneOffset(out, tzoffset);
    break;
  case 'Z':
    out << tzname;
    break;
  case 'N':
    printNineDigits(out, bdt.tm_nsec);
    break;
  default:
    out << '%' << spec;
    break;
  }
}